

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

bool_t priRMTest(word *a,size_t n,size_t iter,void *stack)

{
  bool_t bVar1;
  int iVar2;
  u32 seed;
  qr_o *a_00;
  size_t *psVar3;
  size_t sVar4;
  word *mod;
  word *a_01;
  word *b;
  size_t m_00;
  word *in_RCX;
  word *in_RDX;
  size_t in_RSI;
  word *in_RDI;
  octet *combo_state;
  qr_o *qr;
  word *base;
  word *r;
  size_t i;
  size_t m;
  size_t s;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  word in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  size_t *mod_00;
  word *in_stack_ffffffffffffff80;
  qr_o *r_00;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  bool bVar5;
  size_t *n_00;
  word *a_02;
  qr_o *pqVar6;
  qr_o *r_01;
  word *pwVar7;
  uint local_4;
  
  a_00 = (qr_o *)(in_RCX + in_RSI);
  psVar3 = &(a_00->hdr).keep + in_RSI;
  n_00 = psVar3;
  sVar4 = zmCreate_keep((size_t)in_stack_ffffffffffffff80);
  mod = (word *)((long)n_00 + sVar4);
  pwVar7 = mod;
  sVar4 = prngCOMBO_keep();
  a_01 = (word *)((long)mod + sVar4);
  sVar4 = wwWordSize(in_RDI,in_RSI);
  bVar1 = zzIsEven(in_RDI,sVar4);
  if (bVar1 == 0) {
    if ((sVar4 == 1) && (*in_RDI < 0x31)) {
      bVar5 = false;
      if ((*in_RDI != 1) &&
         (((*in_RDI == 3 || (bVar5 = false, *in_RDI % 3 != 0)) && (bVar5 = true, *in_RDI != 5)))) {
        bVar5 = *in_RDI % 5 != 0;
      }
      local_4 = (uint)bVar5;
    }
    else {
      a_02 = pwVar7;
      seed = utilNonce32();
      prngCOMBOStart(pwVar7,seed);
      u64To(pwVar7,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),(u64 *)0x194f31);
      mod_00 = psVar3;
      r_00 = a_00;
      memNonZeroSize(a_00,sVar4 << 3);
      zmCreate(r_00,(octet *)mod_00,(size_t)pwVar7,
               (void *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      wwCopy(in_RCX,in_RDI,sVar4);
      zzSubW2(in_RCX,sVar4,1);
      b = (word *)wwLoZeroBits((word *)CONCAT17(in_stack_ffffffffffffff8f,
                                                CONCAT16(in_stack_ffffffffffffff8e,
                                                         in_stack_ffffffffffffff88)),(size_t)r_00);
      wwShLo((word *)r_00,(size_t)mod_00,(size_t)pwVar7);
      m_00 = wwWordSize(in_RCX,sVar4);
      do {
        do {
          if (in_RDX == (word *)0x0) {
            return 1;
          }
          pqVar6 = (qr_o *)0x0;
          in_RDX = (word *)((long)in_RDX + -1);
          do {
            r_01 = (qr_o *)((long)&(pqVar6->hdr).keep + 1);
            if ((0x280 < (ulong)((long)pqVar6 * 0x2d)) ||
               (bVar1 = zzRandNZMod(a_02,mod,(size_t)n_00,
                                    (gen_i)CONCAT17(in_stack_ffffffffffffff8f,
                                                    CONCAT16(in_stack_ffffffffffffff8e,
                                                             in_stack_ffffffffffffff88)),r_00),
               bVar1 == 0)) {
              return 0;
            }
            bVar1 = wwEq((word *)a_00,(word *)psVar3[4],sVar4);
            bVar5 = true;
            if (bVar1 == 0) {
              bVar1 = zzIsSumEq(in_RDI,(word *)a_00,(word *)psVar3[4],sVar4);
              bVar5 = bVar1 != 0;
            }
            pqVar6 = r_01;
          } while (bVar5);
          qrPower(in_RDX,a_01,b,m_00,r_01,in_RCX);
          bVar1 = wwEq((word *)a_00,(word *)psVar3[4],sVar4);
        } while ((bVar1 != 0) ||
                (bVar1 = zzIsSumEq(in_RDI,(word *)a_00,(word *)psVar3[4],sVar4), bVar1 != 0));
        for (pwVar7 = (word *)0x1; pwVar7 < b; pwVar7 = (word *)((long)pwVar7 + 1)) {
          (*(code *)psVar3[0xe])(a_00,a_00,psVar3,a_01);
          bVar1 = wwEq((word *)a_00,(word *)psVar3[4],sVar4);
          if (bVar1 != 0) {
            return 0;
          }
          bVar1 = zzIsSumEq(in_RDI,(word *)a_00,(word *)psVar3[4],sVar4);
          if (bVar1 != 0) break;
        }
      } while (pwVar7 != b);
      local_4 = 0;
    }
  }
  else {
    iVar2 = wwCmpW(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_4 = (uint)(iVar2 == 0);
  }
  return local_4;
}

Assistant:

bool_t priRMTest(const word a[], size_t n, size_t iter, void* stack)
{
	register size_t s;
	register size_t m;
	register size_t i;
	// переменные в stack
	word* r = (word*)stack;
	word* base = r + n;
	qr_o* qr = (qr_o*)(base + n);
	octet* combo_state = (octet*)qr + zmCreate_keep(O_OF_W(n));
	stack = combo_state + prngCOMBO_keep();
	// pre
	ASSERT(wwIsValid(a, n));
	// нормализация
	n = wwWordSize(a, n);
	// четное?
	if (zzIsEven(a, n))
		return wwCmpW(a, n, 2) == 0;
	// маленькое?
	if (n == 1 && a[0] < 49)
		return a[0] != 1 && (a[0] == 3 || a[0] % 3) && (a[0] == 5 || a[0] % 5);
	// подготовить генератор
	prngCOMBOStart(combo_state, utilNonce32());
	// создать кольцо
	wwTo(base, O_OF_W(n), a);
	zmCreate(qr, (octet*)base, memNonZeroSize(base, O_OF_W(n)), stack);
	// a - 1 = r 2^s (r -- нечетное)
	wwCopy(r, a, n);
	zzSubW2(r, n, 1);
	s = wwLoZeroBits(r, n);
	wwShLo(r, n, s);
	m = wwWordSize(r, n);
	// итерации
	while (iter--)
	{
		// base <-R {1, \ldots, a - 1} \ {\pm one}
		i = 0;
		do
			if (i++ * 45 > B_PER_IMPOSSIBLE * 10 || 
				!zzRandNZMod(base, a, n, prngCOMBOStepR, combo_state))
			{
				s = m = 0;
				return FALSE;
			}
		while (wwEq(base, qr->unity, n) || zzIsSumEq(a, base, qr->unity, n));
		// base <- base^r \mod a
		qrPower(base, base, r, m, qr, stack);
		// base == \pm one => тест пройден
		if (wwEq(base, qr->unity, n) || zzIsSumEq(a, base, qr->unity, n))
			continue;
		// base^{2^i} \equiv -1 \mod a?
		for (i = 1; i < s; ++i)
		{
			qrSqr(base, base, qr, stack);
			if (wwEq(base, qr->unity, n))
			{
				s = m = i = 0;
				return FALSE;
			}
			if (zzIsSumEq(a, base, qr->unity, n))
				break;
		}
		if (i == s)
		{
			s = m = i = 0;
			return FALSE;
		}
	}
	s = m = i = 0;
	// простое
	return TRUE;
}